

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load(CVmImageLoader *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  vm_meta_entry_t *this_00;
  CVmImageLoader *in_RDI;
  ulong in_stack_00000018;
  vm_meta_entry_t *mcoll;
  CVmImageLoaderMres_std res_ifc_1;
  CVmImageLoaderMres *in_stack_00000040;
  ulong in_stack_00000048;
  CVmImageLoaderMres_std res_ifc;
  uint flags;
  ulong siz;
  ulong in_stack_00000078;
  int done;
  char buf [128];
  CVmImageLoaderMres *in_stack_00000130;
  ulong in_stack_00000138;
  CVmImageLoader *in_stack_00000140;
  CVmImageLoader *in_stack_00000810;
  CVmImageLoader *in_stack_00001080;
  ulong in_stack_fffffffffffffef8;
  CVmImageLoader *in_stack_ffffffffffffff00;
  undefined1 *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff28;
  CVmImageLoader *in_stack_ffffffffffffff30;
  CVmMetaTable *in_stack_ffffffffffffff38;
  CVmImageLoader *in_stack_ffffffffffffff40;
  ulong in_stack_ffffffffffffff48;
  CVmImageLoader *in_stack_ffffffffffffff50;
  ulong in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  char local_88 [4];
  undefined1 auStack_84 [4];
  CVmImageLoader *in_stack_ffffffffffffff80;
  ulong in_stack_ffffffffffffffa8;
  CVmImageLoader *in_stack_ffffffffffffffb0;
  
  G_image_loader_X = in_RDI;
  vm_init_before_load(in_RDI->fname_);
  (*G_host_ifc_X->_vptr_CVmHostIfc[8])(G_host_ifc_X,in_RDI->fname_);
  read_image_header(in_stack_ffffffffffffff80);
  bVar1 = false;
  while (!bVar1) {
    (*in_RDI->fp_->_vptr_CVmImageFile[3])(in_RDI->fp_,local_88,10);
    uVar4 = ::osrp4(auStack_84);
    uVar2 = ::osrp2(&stack0xffffffffffffff80);
    iVar3 = block_type_is(local_88,"CPPG");
    if (iVar3 == 0) {
      iVar3 = block_type_is(local_88,"ENTP");
      if (iVar3 == 0) {
        iVar3 = block_type_is(local_88,"OBJS");
        if (iVar3 == 0) {
          iVar3 = block_type_is(local_88,"CPDF");
          if (iVar3 == 0) {
            iVar3 = block_type_is(local_88,"MRES");
            if (iVar3 == 0) {
              iVar3 = block_type_is(local_88,"MREL");
              if (iVar3 == 0) {
                iVar3 = block_type_is(local_88,"MCLD");
                if (iVar3 == 0) {
                  iVar3 = block_type_is(local_88,"FNSD");
                  if (iVar3 == 0) {
                    iVar3 = block_type_is(local_88,"SYMD");
                    if (iVar3 == 0) {
                      iVar3 = block_type_is(local_88,"SRCF");
                      if (iVar3 == 0) {
                        iVar3 = block_type_is(local_88,"GSYM");
                        if (iVar3 == 0) {
                          iVar3 = block_type_is(local_88,"MACR");
                          if (iVar3 == 0) {
                            iVar3 = block_type_is(local_88,"MHLS");
                            if (iVar3 == 0) {
                              iVar3 = block_type_is(local_88,"SINI");
                              if (iVar3 == 0) {
                                iVar3 = block_type_is(local_88,"EOF ");
                                if (iVar3 == 0) {
                                  if ((uVar2 & 1) != 0) {
                                    err_throw_a(0x131,1,8);
                                  }
                                  (*in_RDI->fp_->_vptr_CVmImageFile[9])
                                            (in_RDI->fp_,uVar4 & 0xffffffff);
                                }
                                else {
                                  bVar1 = true;
                                }
                              }
                              else {
                                load_sini((CVmImageLoader *)
                                          CONCAT44(uVar2,in_stack_ffffffffffffff60),
                                          in_stack_ffffffffffffff58);
                              }
                            }
                            else {
                              load_mhls(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
                            }
                          }
                          else {
                            load_macros(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
                          }
                        }
                        else {
                          load_gsym(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
                        }
                      }
                      else {
                        load_srcfiles(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
                      }
                    }
                    else {
                      load_sym_names((CVmImageLoader *)res_ifc._16_8_,(ulong)res_ifc.hostifc_);
                    }
                  }
                  else {
                    load_funcset_dep((CVmImageLoader *)mcoll,in_stack_00000018);
                  }
                }
                else {
                  load_meta_dep((CVmImageLoader *)buf._0_8_,in_stack_00000078);
                }
              }
              else {
                in_stack_ffffffffffffff00 = (CVmImageLoader *)&stack0xffffffffffffff20;
                CVmImageLoaderMres_std::CVmImageLoaderMres_std
                          ((CVmImageLoaderMres_std *)in_RDI,
                           (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                           (CVmHostIfc *)in_stack_ffffffffffffff00);
                load_mres_link(in_stack_00000140,in_stack_00000138,in_stack_00000130);
                CVmImageLoaderMres_std::~CVmImageLoaderMres_std((CVmImageLoaderMres_std *)0x30984e);
              }
            }
            else {
              in_stack_ffffffffffffff08 = &stack0xffffffffffffff48;
              CVmImageLoaderMres_std::CVmImageLoaderMres_std
                        ((CVmImageLoaderMres_std *)in_RDI,
                         (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                         (CVmHostIfc *)in_stack_ffffffffffffff00);
              load_mres((CVmImageLoader *)res_ifc.super_CVmImageLoaderMres._vptr_CVmImageLoaderMres,
                        in_stack_00000048,in_stack_00000040);
              CVmImageLoaderMres_std::~CVmImageLoaderMres_std((CVmImageLoaderMres_std *)0x3097d8);
            }
          }
          else {
            load_const_pool_def(in_stack_ffffffffffffff40,(ulong)in_stack_ffffffffffffff38);
          }
        }
        else {
          load_static_objs((CVmImageLoader *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58);
        }
      }
      else {
        load_entrypt(in_stack_ffffffffffffff30,(ulong)in_stack_ffffffffffffff28);
      }
    }
    else {
      load_const_pool_page(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
  }
  if (((byte)in_RDI->field_0x90 >> 2 & 1) == 0) {
    err_throw(0);
  }
  if ((in_RDI->field_0x90 & 1) == 0) {
    err_throw(0);
  }
  if (((byte)in_RDI->field_0x90 >> 1 & 1) != 0) {
    do_dynamic_link(in_stack_00000810);
    fix_gsym_meta(in_RDI);
    CVmMetaTable::create_intrinsic_class_instances((CVmMetaTable *)in_RDI);
    this_00 = CVmMetaTable::get_entry_by_id
                        (in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    if (this_00 != (vm_meta_entry_t *)0x0) {
      G_iter_get_next_X = vm_meta_entry_t::xlat_func(this_00,1);
      G_iter_next_avail_X = vm_meta_entry_t::xlat_func(this_00,2);
    }
    (*G_code_pool_X.super_CVmPoolPaged.super_CVmPool._vptr_CVmPool[2])
              (&G_code_pool_X,in_RDI->pools_[0]);
    (*G_const_pool_X.super_CVmPoolPaged.super_CVmPool._vptr_CVmPool[2])
              (&G_const_pool_X,in_RDI->pools_[1]);
    CVmObjTable::do_all_post_load_init((CVmObjTable *)in_stack_ffffffffffffff00);
    iVar3 = (*G_host_ifc_X->_vptr_CVmHostIfc[0xb])();
    if (iVar3 != 0) {
      load_ext_resfiles(in_stack_00001080);
    }
    vm_init_after_load();
    os_init_ui_after_load(G_bif_table_X,G_meta_table_X);
    G_image_loader_X = (CVmImageLoader *)0x0;
    return;
  }
  err_throw(0);
}

Assistant:

void CVmImageLoader::load(VMG0_)
{
    char buf[128];
    int done;

    /* set myself to be the global image loader */
    G_image_loader = this;

    /* 
     *   perform additional initialization now that we're about to load
     *   the image file 
     */
    vm_init_before_load(vmg_ fname_);

    /* tell the host application the name of the image file */
    G_host_ifc->set_image_name(fname_);

    /* read and validate the header */
    read_image_header();

    /* load the data blocks */
    for (done = FALSE ; !done ; )
    {
        ulong siz;
        uint flags;
        
        /* read the next data block header */
        fp_->copy_data(buf, 10);

        /* get the size */
        siz = t3rp4u(buf + 4);

        /* get the flags */
        flags = osrp2(buf + 8);

        /* load the block according to its type */
        if (block_type_is(buf, "CPPG"))
        {
            /* load the constant pool page block */
            load_const_pool_page(siz);
        }
        else if (block_type_is(buf, "ENTP"))
        {
            /* load the entrypoint */
            load_entrypt(vmg_ siz);
        }
        else if (block_type_is(buf, "OBJS"))
        {
            /* load static object block */
            load_static_objs(vmg_ siz);
        }
        else if (block_type_is(buf, "CPDF"))
        {
            /* load the constant pool definition block */
            load_const_pool_def(siz);
        }
        else if (block_type_is(buf, "MRES"))
        {
            /* 
             *   load the multimedia resource block (the main image file
             *   is always file number zero) 
             */
            CVmImageLoaderMres_std res_ifc(0, G_host_ifc);
            load_mres(siz, &res_ifc);
        }
        else if (block_type_is(buf, "MREL"))
        {
            /* load the multimedia resource link block */
            CVmImageLoaderMres_std res_ifc(0, G_host_ifc);
            load_mres_link(siz, &res_ifc);
        }
        else if (block_type_is(buf, "MCLD"))
        {
            /* load metaclass dependency block */
            load_meta_dep(vmg_ siz);
        }
        else if (block_type_is(buf, "FNSD"))
        {
            /* load function set dependency list block */
            load_funcset_dep(vmg_ siz);
        }
        else if (block_type_is(buf, "SYMD"))
        {
            /* load symbolic names export block */
            load_sym_names(vmg_ siz);
        }
        else if (block_type_is(buf, "SRCF"))
        {
            /* load the source file list */
            load_srcfiles(vmg_ siz);
        }
        else if (block_type_is(buf, "GSYM"))
        {
            /* load the global symbols block */
            load_gsym(vmg_ siz);
        }
        else if (block_type_is(buf, "MACR"))
        {
            /* load the macro symbols block */
            load_macros(vmg_ siz);
        }
        else if (block_type_is(buf, "MHLS"))
        {
            /* load the method header list block */
            load_mhls(vmg_ siz);
        }
        else if (block_type_is(buf, "SINI"))
        {
            /* load the static initializer block */
            load_sini(vmg_ siz);
        }
        else if (block_type_is(buf, "EOF "))
        {
            /* end of file - we can stop looking now */
            done = TRUE;
        }
        else
        {
            /*
             *   This block type is unknown, so ignore it.  If a new block
             *   type is added in the future, an older VM version won't
             *   recognize the new block, but it can still load the image
             *   file simply by omitting any unrecognized new blocks.  Since
             *   the image file will not be complete in this case, it may not
             *   work properly.
             *   
             *   To allow for future block types which contain advisory data,
             *   which can safely be ignored by older VM versions, while also
             *   allowing for the possibility of changes that create
             *   incompatibilities, we have a flag in the header that
             *   indicates whether the block is required or not.  If this
             *   block is marked as mandatory, throw an error, since we don't
             *   recognize the block.  Note that this is a version-related
             *   error (i.e., a VM update should fix it), so set the version
             *   flag in the exception.  
             */
            if ((flags & VMIMAGE_DBF_MANDATORY) != 0)
                err_throw_a(VMERR_UNKNOWN_IMAGE_BLOCK, 1,
                            ERR_TYPE_VERSION_FLAG);

            /* skip past the block */
            fp_->skip_ahead(siz);
        }
    }

    /* the image file is required to contain an entrypoint definition */
    if (!loaded_entrypt_)
        err_throw(VMERR_IMAGE_NO_ENTRYPT);

    /* the image file is required to contain a metaclass dependency table */
    if (!loaded_meta_dep_)
        err_throw(VMERR_IMAGE_NO_METADEP);

    /* the image is required to have a function set dependency table */
    if (!loaded_funcset_dep_)
        err_throw(VMERR_IMAGE_NO_FUNCDEP);

    /* complete the dynamic linking */
    do_dynamic_link(vmg0_);

    /* fix up the global symbol table metaclasses, if applicable */
    fix_gsym_meta(vmg0_);

    /* 
     *   create an IntrinsicClass instance for each metaclass that the
     *   image file is using and for which the compiler didn't supply its
     *   own IntrinsicClass object 
     */
    G_meta_table->create_intrinsic_class_instances(vmg0_);

    /* 
     *   Cache certain metaclass method table entries that are used by the
     *   VM: Iterator.getNext [Iterator#1], Iterator.isNextAvailable
     *   [Iterator#2].  
     */
    vm_meta_entry_t *mcoll = G_meta_table->get_entry_by_id("iterator");
    if (mcoll != 0)
    {
        G_iter_get_next = mcoll->xlat_func(1);
        G_iter_next_avail = mcoll->xlat_func(2);
    }

    /* 
     *   Attach the code pool and constant pool to their backing stores,
     *   which are the pool objects we loaded from the image file. 
     */
    G_code_pool->attach_backing_store(pools_[0]);
    G_const_pool->attach_backing_store(pools_[1]);

    /* perform any requested post-load object initializations */
    G_obj_table->do_all_post_load_init(vmg0_);

    /* load external resource files if possible */
    if (G_host_ifc->can_add_resfiles())
        load_ext_resfiles(vmg0_);

    /* 
     *   perform additional initialization now that we've finished
     *   loading the image file
     */
    vm_init_after_load(vmg0_);

    /* 
     *   Let the UI inspect the built-ins linked by the program.  The UI
     *   might use different initial display configurations depending on the
     *   function sets and/or intrinsic classes the program uses.  For
     *   example, Workbench on Windows initially hides the HTML TADS window
     *   if the network functions are linked, since these are normally used
     *   to implement a Web UI, which uses a separate display window.
     */
    os_init_ui_after_load(G_bif_table, G_meta_table);

    /* forget the image loader */
    G_image_loader = 0;
}